

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::~basic_json_parser
          (basic_json_parser<char,_std::allocator<char>_> *this)

{
  basic_json_parser<char,_std::allocator<char>_> *in_RDI;
  
  ~basic_json_parser(in_RDI);
  operator_delete(in_RDI,0xf8);
  return;
}

Assistant:

~basic_json_parser() noexcept
    {
    }